

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O3

int tool_progress_cb(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong __n;
  long lVar7;
  char format [40];
  char line [257];
  undefined1 local_168 [48];
  undefined1 local_138 [272];
  
  lVar5 = *(long *)((long)clientp + 8);
  lVar7 = *(long *)((long)clientp + 0x20) + (long)ulnow + (long)dlnow;
  lVar3 = *(long *)((long)clientp + 0x20) + (long)ultotal + (long)dltotal;
  if ((long)ultotal + (long)dltotal < (long)ulnow + (long)dlnow) {
    lVar3 = lVar7;
  }
  *(int *)clientp = *clientp + 1;
  if (lVar3 < 1) {
    lVar3 = lVar5 + 0x3ff;
    if (-1 < lVar5) {
      lVar3 = lVar5;
    }
    lVar5 = lVar7 + 0x3ff;
    if (-1 < lVar7) {
      lVar5 = lVar7;
    }
    lVar6 = (lVar5 >> 10) - (lVar3 >> 10);
    if (lVar6 != 0 && lVar3 >> 10 <= lVar5 >> 10) {
      do {
        curl_mfprintf(*(undefined8 *)((long)clientp + 0x18),"#");
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  else if (lVar7 != lVar5) {
    iVar4 = *(int *)((long)clientp + 0x10) + -7;
    uVar2 = (uint)((double)iVar4 * ((double)lVar7 / (double)lVar3));
    if ((int)uVar2 < 1) {
      __n = 0;
    }
    else {
      uVar1 = 0x100;
      if (uVar2 < 0x100) {
        uVar1 = uVar2;
      }
      __n = (ulong)uVar1;
      memset(local_138,0x23,__n);
    }
    local_138[__n] = 0;
    curl_msnprintf(local_168,0x28,"\r%%-%ds %%5.1f%%%%",iVar4);
    curl_mfprintf(((double)lVar7 / (double)lVar3) * 100.0,*(undefined8 *)((long)clientp + 0x18),
                  local_168,local_138);
  }
  fflush(*(FILE **)((long)clientp + 0x18));
  *(long *)((long)clientp + 8) = lVar7;
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     double dltotal, double dlnow,
                     double ultotal, double ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  char line[MAX_BARLENGTH+1];
  char format[40];
  double frac;
  double percent;
  int barwidth;
  int num;
  int i;

  struct ProgressData *bar = (struct ProgressData *)clientp;

  /* expected transfer size */
  curl_off_t total = (curl_off_t)dltotal + (curl_off_t)ultotal +
    bar->initial_size;

  /* we've come this far */
  curl_off_t point = (curl_off_t)dlnow + (curl_off_t)ulnow +
    bar->initial_size;

  if(point > total)
    /* we have got more than the expected total! */
    total = point;

  /* simply count invokes */
  bar->calls++;

  if(total < 1) {
    curl_off_t prevblock = bar->prev / 1024;
    curl_off_t thisblock = point / 1024;
    while(thisblock > prevblock) {
      fprintf(bar->out, "#");
      prevblock++;
    }
  }
  else if(point != bar->prev) {
    frac = (double)point / (double)total;
    percent = frac * 100.0f;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    for(i = 0; i < num; i++)
      line[i] = '#';
    line[i] = '\0';
    snprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;

  return 0;
}